

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

err_t RenderBlockData(matroska_block *Element,stream *Output,bool_t bForceWithoutMandatory,
                     bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  ushort uVar1;
  int16_t iVar2;
  ebml_master *peVar3;
  void *pvVar4;
  bool bVar5;
  int64_t iVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  ebml_context *peVar11;
  bool_t bVar12;
  long lVar13;
  ebml_master *peVar14;
  ebml_integer *Element_00;
  char *pcVar15;
  ebml_context *peVar16;
  size_t sVar17;
  filepos_t fVar18;
  filepos_t fVar19;
  err_t eVar20;
  long lVar21;
  size_t sVar22;
  byte *pbVar23;
  ulong uVar24;
  uint8_t *Cursor;
  uint uVar25;
  int *piVar26;
  ulong uVar27;
  size_t Written;
  size_t ToWrite;
  uint8_t BlockHead [5];
  uint8_t *OutBuf;
  ebml_integer *local_90;
  long local_88;
  char *local_80;
  int64_t local_78;
  long *local_70;
  size_t local_68;
  byte local_5d;
  byte local_5c;
  byte local_5b [3];
  ulong local_58;
  uint8_t *local_50;
  array local_48;
  stream *local_38;
  
  cVar7 = Element->Lacing;
  if (cVar7 == '\x04') {
    __assert_fail("Element->Lacing != LACING_AUTO",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x6a7,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  uVar1 = Element->TrackNumber;
  if (uVar1 < 0x80) {
    pbVar23 = &local_5c;
    local_5d = (byte)uVar1 | 0x80;
    lVar21 = 4;
  }
  else {
    if (0x3fff < uVar1) {
      return -3;
    }
    pbVar23 = local_5b;
    local_5d = (byte)(uVar1 >> 8) | 0x40;
    lVar21 = 5;
    local_5c = (byte)uVar1;
  }
  iVar2 = Element->LocalTimestamp;
  pbVar23[1] = (byte)iVar2;
  *pbVar23 = (byte)((ushort)iVar2 >> 8);
  pbVar23[2] = 0;
  pbVar23[2] = cVar7 * '\x02' | (Element->Invisible != 0) << 3;
  local_70 = Rendered;
  peVar11 = MATROSKA_getContextSimpleBlock();
  bVar12 = EBML_ElementIsType((ebml_element *)Element,peVar11);
  if (bVar12 != 0) {
    if (Element->IsKeyframe != 0) {
      pbVar23[2] = pbVar23[2] | 0x80;
    }
    if (Element->IsDiscardable != 0) {
      pbVar23[2] = pbVar23[2] | 1;
    }
  }
  if (Output == (stream *)0x0) {
    __assert_fail("(const void*)(Output)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x6c7,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  lVar13 = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,&local_5d,lVar21,&local_88);
  if (lVar13 != 0) {
    return lVar13;
  }
  if (local_88 != lVar21) {
    return -0x16;
  }
  if (local_70 != (long *)0x0) {
    *local_70 = local_88;
  }
  peVar14 = Element->WriteTrack;
  if (peVar14 == (ebml_master *)0x0) {
    __assert_fail("Element->WriteTrack!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x6d2,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  peVar11 = MATROSKA_getContextContentEncodings();
  peVar14 = (ebml_master *)EBML_MasterFindFirstElt(peVar14,peVar11,0,0,0);
  uVar24 = 1;
  local_78 = 0xffffffff;
  if (peVar14 == (ebml_master *)0x0) {
LAB_0010e403:
    lVar21 = 0;
    local_90 = (ebml_integer *)0x0;
  }
  else {
    peVar11 = MATROSKA_getContextContentEncoding();
    peVar14 = (ebml_master *)EBML_MasterFindFirstElt(peVar14,peVar11,0,0,0);
    if ((peVar14->Base).Base.Children == (nodetree *)0x0) goto LAB_0010e403;
    peVar3 = (ebml_master *)(peVar14->Base).Base.Next;
    if (peVar14 == peVar3) {
      __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x6d9,
                    "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    if (peVar3 != (ebml_master *)0x0) {
      return -3;
    }
    peVar11 = MATROSKA_getContextContentEncodingScope();
    Element_00 = (ebml_integer *)EBML_MasterFindFirstElt(peVar14,peVar11,0,0,0);
    if (Element_00 == (ebml_integer *)0x0) {
      uVar24 = 1;
    }
    else {
      uVar24 = EBML_IntegerValue(Element_00);
    }
    peVar11 = MATROSKA_getContextContentCompression();
    peVar14 = (ebml_master *)EBML_MasterFindFirstElt(peVar14,peVar11,0,0,0);
    if (peVar14 == (ebml_master *)0x0) {
      return -3;
    }
    peVar11 = MATROSKA_getContextContentCompAlgo();
    local_90 = (ebml_integer *)EBML_MasterFindFirstElt(peVar14,peVar11,1,1,ForProfile);
    if (local_90 == (ebml_integer *)0x0) {
      local_78 = 0xffffffff;
    }
    else {
      local_78 = EBML_IntegerValue(local_90);
    }
    iVar10 = (int)local_78;
    if (iVar10 != 3) {
      lVar21 = (ulong)(iVar10 == 0) * 5 + -5;
    }
    else {
      peVar11 = MATROSKA_getContextContentCompSettings();
      lVar21 = 0;
      local_90 = (ebml_integer *)EBML_MasterFindFirstElt(peVar14,peVar11,0,0,0);
    }
    if (iVar10 != 3 && iVar10 != 0) {
      return lVar21;
    }
  }
  if (Element->Lacing == '\x04') {
    cVar7 = GetBestLacingType(Element,ForProfile);
    Element->Lacing = cVar7;
  }
  cVar7 = Element->Lacing;
  local_58 = uVar24;
  if (cVar7 == '\0') goto LAB_0010e698;
  uVar27 = (Element->SizeList)._Used;
  pcVar15 = (char *)malloc((uVar27 & 0xfffffffffffffffc) + 1);
  if (pcVar15 == (char *)0x0) {
    lVar21 = -2;
LAB_0010e66b:
    bVar5 = false;
  }
  else {
    *pcVar15 = (char)(uVar27 >> 2) + -1;
    local_80 = pcVar15;
    if (cVar7 == '\x03') {
      fVar18 = GetBlockFrameSize(Element,0,&local_90->Base,(MatroskaTrackEncodingCompAlgo)local_78,
                                 (MatroskaContentEncodingScope)uVar24);
      sVar22 = 1;
      bVar8 = EBML_CodedSizeLength((long)(int)fVar18,'\0',1);
      bVar8 = EBML_CodedValueLength((long)(int)fVar18,(ulong)bVar8,(uint8_t *)(local_80 + 1),1);
      uVar27 = (ulong)bVar8 + 1;
      if (((Element->SizeList)._Used >> 2) - 3 < 0xfffffffffffffffe) {
        do {
          fVar19 = GetBlockFrameSize(Element,sVar22,&local_90->Base,
                                     (MatroskaTrackEncodingCompAlgo)local_78,
                                     (MatroskaContentEncodingScope)uVar24);
          lVar21 = (long)((int)fVar19 - (int)fVar18);
          bVar8 = EBML_CodedSizeLengthSigned(lVar21,'\0');
          bVar8 = EBML_CodedValueLengthSigned(lVar21,(ulong)bVar8,(uint8_t *)(local_80 + uVar27));
          uVar27 = uVar27 + bVar8;
          sVar22 = sVar22 + 1;
          uVar24 = local_58;
          fVar18 = fVar19;
        } while (sVar22 < ((Element->SizeList)._Used >> 2) - 1);
      }
    }
    else {
      uVar27 = 1;
      if ((cVar7 == '\x01') && (((Element->SizeList)._Used & 0xfffffffffffffffc) != 4)) {
        sVar22 = 0;
        local_38 = Output;
        do {
          uVar24 = GetBlockFrameSize(Element,sVar22,&local_90->Base,
                                     (MatroskaTrackEncodingCompAlgo)local_78,
                                     (MatroskaContentEncodingScope)uVar24);
          pcVar15 = local_80;
          iVar10 = (int)uVar24;
          if (0xfe < iVar10) {
            iVar9 = 0x1fd;
            if (iVar10 < 0x1fd) {
              iVar9 = iVar10;
            }
            uVar25 = (iVar10 - iVar9) + 0xfe;
            memset(local_80 + uVar27,0xff,(ulong)(uVar25 / 0xff + 1));
            uVar27 = uVar27 + (ulong)uVar25 / 0xff + 1;
            uVar24 = (ulong)((iVar10 + uVar25 / 0xff) - 0xff);
            Output = local_38;
          }
          pcVar15[uVar27] = (char)uVar24;
          uVar27 = uVar27 + 1;
          sVar22 = sVar22 + 1;
          uVar24 = local_58;
        } while (sVar22 < ((Element->SizeList)._Used >> 2) - 1);
      }
    }
    if (((Element->SizeList)._Used & 0xfffffffffffffffc) + 1 < uVar27) {
      __assert_fail("LaceSize <= (1 + ARRAYCOUNT(Element->SizeList,int32_t)*4)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x72a,
                    "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    lVar21 = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,local_80,uVar27,&local_88);
    if (lVar21 != 0) goto LAB_0010e66b;
    if (local_70 != (long *)0x0) {
      *local_70 = *local_70 + local_88;
    }
    free(local_80);
    bVar5 = true;
    lVar21 = 0;
  }
  if (!bVar5) {
    return lVar21;
  }
LAB_0010e698:
  if (Element == (matroska_block *)0x0) {
    __assert_fail("(const void*)(Element)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x732,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  (**(code **)((long)(Element->Base).Base.Base.Base.VMT + 0x20))
            (Element,0x180,&Element->WriteTrack,8);
  iVar6 = local_78;
  Cursor = (uint8_t *)(Element->Data)._Begin;
  if ((local_90 == (ebml_integer *)0x0) || ((local_58 & 1) == 0)) {
    local_68 = (Element->Data)._Used;
    lVar21 = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,Cursor,local_68,&local_88);
    if (local_70 != (long *)0x0) {
      *local_70 = *local_70 + local_88;
    }
  }
  else {
    peVar11 = (local_90->Base).Context;
    peVar16 = MATROSKA_getContextContentCompAlgo();
    if (peVar11 == peVar16) {
      if ((int)iVar6 == 0) {
        local_48._Begin = (char *)0x0;
        local_48._Used = 0;
        if (3 < (Element->SizeList)._Used) {
          piVar26 = (int *)(Element->SizeList)._Begin;
          do {
            bVar12 = ArrayResize(&local_48,(long)*piVar26 + 100,0);
            if (bVar12 == 0) {
LAB_0010e9bf:
              ArrayClear(&local_48);
              return -2;
            }
            local_50 = (uint8_t *)local_48._Begin;
            local_68 = local_48._Used;
            eVar20 = CompressFrameZLib(Cursor,(long)*piVar26,&local_50,&local_68);
            if (eVar20 != 0) goto LAB_0010e9bf;
            lVar21 = (**(code **)((long)(Output->Base).VMT + 0x70))
                               (Output,local_50,local_68,&local_88);
            ArrayClear(&local_48);
            if (local_70 != (long *)0x0) {
              *local_70 = *local_70 + local_88;
            }
            if (lVar21 != 0) {
              return lVar21;
            }
            Cursor = Cursor + *piVar26;
            piVar26 = piVar26 + 1;
          } while (piVar26 !=
                   (int *)((Element->SizeList)._Begin +
                          ((Element->SizeList)._Used & 0xfffffffffffffffc)));
          lVar21 = 0;
        }
      }
    }
    else if (3 < (Element->SizeList)._Used) {
      piVar26 = (int *)(Element->SizeList)._Begin;
      do {
        pvVar4 = (void *)local_90->Value;
        sVar17 = EBML_ElementDataSize(&local_90->Base,1);
        iVar10 = bcmp(Cursor,pvVar4,sVar17);
        if (iVar10 != 0) {
          __assert_fail("memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))==0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x761,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        pvVar4 = (void *)local_90->Value;
        sVar17 = EBML_ElementDataSize(&local_90->Base,1);
        iVar10 = bcmp(Cursor,pvVar4,sVar17);
        if (iVar10 != 0) {
          return -3;
        }
        fVar18 = EBML_ElementDataSize(&local_90->Base,1);
        iVar10 = *piVar26;
        fVar19 = EBML_ElementDataSize(&local_90->Base,1);
        local_68 = iVar10 - fVar19;
        lVar21 = (**(code **)((long)(Output->Base).VMT + 0x70))
                           (Output,Cursor + fVar18,local_68,&local_88);
        if (local_70 != (long *)0x0) {
          *local_70 = *local_70 + local_88;
        }
        Cursor = Cursor + fVar18 + local_88;
        piVar26 = piVar26 + 1;
      } while (piVar26 !=
               (int *)((Element->SizeList)._Begin + ((Element->SizeList)._Used & 0xfffffffffffffffc)
                      ));
    }
  }
  return lVar21;
}

Assistant:

static err_t RenderBlockData(matroska_block *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int ForProfile, filepos_t *Rendered)
{
    err_t Err = ERR_NONE;
    uint8_t BlockHead[5], *Cursor;
    size_t ToWrite, Written, BlockHeadSize = 4;
    ebml_element *Elt, *Elt2, *Header = NULL;
    MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    MatroskaContentEncodingScope CompressionScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
    assert(Element->Lacing != LACING_AUTO);

    if (Element->TrackNumber < 0x80)
    {
        BlockHead[0] = 0x80 | (Element->TrackNumber & 0xFF);
        Cursor = &BlockHead[1];
    }
    else if (Element->TrackNumber < 0x4000)
    {
        BlockHead[0] = 0x40 | (Element->TrackNumber >> 8);
        BlockHead[1] = Element->TrackNumber & 0xFF;
        Cursor = &BlockHead[2];
        BlockHeadSize = 5;
    }
    else
        return ERR_INVALID_DATA;

    STORE16BE(Cursor,Element->LocalTimestamp);
    Cursor += 2;

    *Cursor = 0;
    if (Element->Invisible)
        *Cursor |= 0x08;
    *Cursor |= Element->Lacing << 1;
    if (EBML_ElementIsType((ebml_element*)Element, MATROSKA_getContextSimpleBlock()))
    {
        if (Element->IsKeyframe)
            *Cursor |= 0x80;
        if (Element->IsDiscardable)
            *Cursor |= 0x01;
    }

    Err = Stream_Write(Output,BlockHead,BlockHeadSize,&Written);
    if (Err != ERR_NONE)
        goto failed;
    if (Written != BlockHeadSize)
    {
        Err = ERR_WRITE;
        goto failed;
    }
    if (Rendered)
        *Rendered = Written;

    assert(Element->WriteTrack!=NULL);
    Elt = EBML_MasterFindChild(Element->WriteTrack, MATROSKA_getContextContentEncodings());
    if (Elt)
    {
        Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncoding());
        if (EBML_MasterChildren(Elt))
        {
            if (EBML_MasterNext(Elt))
                return ERR_INVALID_DATA; // TODO support cascaded compression/encryption

            Elt2 = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncodingScope());
            if (Elt2)
                CompressionScope = EBML_IntegerValue((ebml_integer*)Elt2);

            Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompression());
            if (!Elt)
                return ERR_INVALID_DATA; // TODO: support encryption

            Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
            if (Header)
                CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
            bool_t CanCompress = 0;
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                CanCompress = 1;
#if defined(CONFIG_ZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                CanCompress = 1;
#endif
            if (!CanCompress)
            {
                Err = ERR_NOT_SUPPORTED;
                goto failed;
            }

            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                Header = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompSettings());
        }
    }

#if !defined(CONFIG_ZLIB)
    if (Header && Header->Context==MATROSKA_getContextContentCompAlgo())
    {
        Err = ERR_NOT_SUPPORTED;
        goto failed;
    }
#endif

    if (Element->Lacing == LACING_AUTO)
        Element->Lacing = GetBestLacingType(Element, ForProfile);
    if (Element->Lacing != LACING_NONE)
    {
        uint8_t *LaceHead = malloc(1 + ARRAYCOUNT(Element->SizeList,int32_t)*4);
        size_t i,LaceSize = 1;
        int32_t DataSize, PrevSize;
        if (!LaceHead)
        {
            Err = ERR_OUT_OF_MEMORY;
            goto failed;
        }
        LaceHead[0] = (ARRAYCOUNT(Element->SizeList,int32_t)-1) & 0xFF; // number of elements in the lace
        if (Element->Lacing == LACING_EBML)
        {
            DataSize = (int32_t)GetBlockFrameSize(Element, 0, Header, CompressionAlgo, CompressionScope);
            LaceSize += EBML_CodedValueLength(DataSize,EBML_CodedSizeLength(DataSize,0,1),LaceHead+LaceSize, 1);
            for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                PrevSize = DataSize;
                DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
                LaceSize += EBML_CodedValueLengthSigned(DataSize-PrevSize,EBML_CodedSizeLengthSigned(DataSize-PrevSize,0),LaceHead+LaceSize);
            }
        }
        else if (Element->Lacing == LACING_XIPH)
        {
            for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
                while (DataSize >= 0xFF)
                {
                    LaceHead[LaceSize++] = 0xFF;
                    DataSize -= 0xFF;
                }
                LaceHead[LaceSize++] = (uint8_t)DataSize;
            }
        }
        else if (Element->Lacing == LACING_FIXED)
        {
            // nothing to write
        }
        assert(LaceSize <= (1 + ARRAYCOUNT(Element->SizeList,int32_t)*4));
        Err = Stream_Write(Output,LaceHead,LaceSize,&Written);
        if (Err != ERR_NONE)
            goto failed;
        if (Rendered)
            *Rendered += Written;
        free(LaceHead);
    }
    Node_SET(Element,MATROSKA_BLOCK_READ_TRACK,&Element->WriteTrack); // now use the write track for consecutive read of the same element

    Cursor = ARRAYBEGIN(Element->Data,uint8_t);
    if (Header && (CompressionScope & MATROSKA_CONTENTENCODINGSCOPE_BLOCK))
    {
        int32_t* i;
        if (Header && Header->Context==MATROSKA_getContextContentCompAlgo())
        {
#if defined(CONFIG_ZLIB)
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
            {
                uint8_t *OutBuf;
                array TmpBuf;
                ArrayInit(&TmpBuf);
                for (i=ARRAYBEGIN(Element->SizeList,int32_t);i!=ARRAYEND(Element->SizeList,int32_t);++i)
                {
                    if (!ArrayResize(&TmpBuf,*i + 100,0))
                    {
                        ArrayClear(&TmpBuf);
                        Err = ERR_OUT_OF_MEMORY;
                        break;
                    }
                    OutBuf = ARRAYBEGIN(TmpBuf,uint8_t);
                    ToWrite = ARRAYCOUNT(TmpBuf,uint8_t);
                    if (CompressFrameZLib(Cursor, *i, &OutBuf, &ToWrite) != ERR_NONE)
                    {
                        ArrayClear(&TmpBuf);
                        Err = ERR_OUT_OF_MEMORY;
                        break;
                    }

                    Err = Stream_Write(Output,OutBuf,ToWrite,&Written);
                    ArrayClear(&TmpBuf);
                    if (Rendered)
                        *Rendered += Written;
                    Cursor += *i;
                    if (Err!=ERR_NONE)
                        break;
                }
            }
#endif
        }
        else
        {
            // header compression
            for (i=ARRAYBEGIN(Element->SizeList,int32_t);i!=ARRAYEND(Element->SizeList,int32_t);++i)
            {
                assert(memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))==0);
                if (memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))!=0)
                {
                    Err = ERR_INVALID_DATA;
                    goto failed;
                }
                Cursor += EBML_ElementDataSize(Header, 1);
                ToWrite = *i - (size_t)EBML_ElementDataSize(Header, 1);
                Err = Stream_Write(Output,Cursor,ToWrite,&Written);
                if (Rendered)
                    *Rendered += Written;
                Cursor += Written;
            }
        }
    }
    else
    {
        ToWrite = ARRAYCOUNT(Element->Data,uint8_t);
        Err = Stream_Write(Output,Cursor,ToWrite,&Written);
        if (Rendered)
            *Rendered += Written;
    }

failed:
    return Err;
}